

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *poVar1;
  AssertionResult *pAVar2;
  pointer pcVar3;
  ostream *poVar4;
  char *local_40;
  long local_38;
  char local_30 [16];
  size_t local_20;
  
  (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x17);
  poVar1 = this->stream;
  pAVar2 = this->result;
  pcVar3 = (pAVar2->m_info).lineInfo.file._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + (pAVar2->m_info).lineInfo.file._M_string_length);
  local_20 = (pAVar2->m_info).lineInfo.line;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  (**(code **)(*Colour::impl + 0x10))(Colour::impl,0);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ": ";
            }